

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O1

uint64_t farmhashuo::Hash64WithSeeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong local_60;
  
  if (len < 0x41) {
    uVar1 = farmhashna::Hash64(s,len);
    uVar4 = (uVar1 - seed0 ^ seed1) * -0x622015f714c7d297;
    uVar4 = (uVar4 >> 0x2f ^ seed1 ^ uVar4) * -0x622015f714c7d297;
    uVar1 = (uVar4 >> 0x2f ^ uVar4) * -0x622015f714c7d297;
  }
  else {
    plVar2 = (long *)(s + (len - 1 & 0xffffffffffffffc0));
    uVar4 = (ulong)((uint)(len - 1) & 0x3f);
    if (s + (len - 0x40) != (char *)((uVar4 - 0x3f) + (long)plVar2)) {
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash.cc"
                    ,0x271,
                    "uint64_t farmhashuo::Hash64WithSeeds(const char *, size_t, uint64_t, uint64_t)"
                   );
    }
    lVar11 = seed1 * -0x651e95c4d06fbfb1 + 0x71;
    uVar8 = (ulong)(lVar11 * -0x651e95c4d06fbfb1) >> 0x2f ^ lVar11 * -0x651e95c4d06fbfb1;
    local_60 = uVar8 * -0x651e95c4d06fbfb1;
    lVar16 = seed0 + uVar8 * 0x651e95c4d06fbfb1;
    lVar3 = (ulong)((uint)lVar16 & 0x82) + 0x9ae16a3b2f90404f;
    lVar19 = seed0 * -0x651e95c4d06fbfb1;
    lVar9 = 0;
    uVar8 = 0;
    do {
      lVar20 = *(long *)((long)s + 8);
      lVar5 = *(long *)((long)s + 0x30);
      lVar10 = uVar8 + *(long *)((long)s + 0x38);
      uVar8 = (local_60 + *(long *)((long)s + 0x18)) * lVar3;
      lVar14 = (uVar8 >> 0x20 | uVar8 << 0x20) + lVar10;
      lVar17 = *(long *)s + lVar5 + lVar14 * 9;
      uVar12 = lVar11 + *(long *)((long)s + 0x10);
      uVar8 = seed0 + *(long *)((long)s + 0x20);
      lVar18 = (uVar8 >> 0x21 | uVar8 * 0x80000000) + *(long *)((long)s + 0x10);
      uVar6 = seed1 + lVar20 + *(long *)((long)s + 0x28);
      uVar8 = lVar19 + *(long *)s + lVar20;
      uVar8 = (uVar8 >> 0x1a | uVar8 << 0x26) * 9;
      lVar9 = (lVar9 + lVar5 ^ uVar8) * 9 + *(long *)((long)s + 0x20);
      lVar20 = uVar8 + lVar20;
      local_60 = uVar12 >> 0x1d | uVar12 << 0x23;
      lVar11 = lVar16 + *(long *)((long)s + 0x38) + lVar18;
      lVar16 = lVar20 - lVar11;
      seed0 = lVar18 + lVar16;
      uVar8 = lVar5 + *(long *)((long)s + 0x28) + lVar10 + lVar14 + lVar16;
      seed1 = (uVar6 >> 0x1e | uVar6 << 0x22) + *(long *)((long)s + 0x18) + lVar9;
      lVar9 = lVar9 + seed1;
      lVar19 = lVar20 + uVar8;
      uVar8 = uVar8 >> 0x22 | uVar8 * 0x40000000;
      s = (char *)((long)s + 0x40);
      lVar16 = lVar17;
    } while ((long *)s != plVar2);
    uVar7 = seed1 >> 0x1c | seed1 << 0x24;
    uVar15 = seed0 >> 0x14 | seed0 << 0x2c;
    lVar17 = lVar17 * 9 + lVar11;
    uVar13 = lVar11 + lVar17;
    lVar16 = *(long *)((long)plVar2 + (uVar4 - 0x37));
    lVar11 = *(long *)((long)plVar2 + (uVar4 - 0x2f));
    uVar12 = (uVar15 - lVar19) + lVar16 + uVar13;
    uVar6 = *(ulong *)((long)plVar2 + (uVar4 - 0xf));
    uVar13 = uVar7 ^ uVar6 ^ uVar13;
    uVar12 = uVar8 * 9 ^ (uVar12 >> 0x25 | uVar12 * 0x8000000) * lVar3;
    lVar19 = *(long *)((long)plVar2 + (uVar4 - 0x17));
    uVar15 = uVar15 + lVar19 + (uVar13 >> 0x2a | uVar13 << 0x16) * lVar3;
    local_60 = local_60 + lVar9 + uVar4;
    uVar13 = local_60 >> 0x21 | local_60 * 0x80000000;
    lVar5 = uVar13 * lVar3;
    lVar20 = *(long *)((long)plVar2 + (uVar4 - 7));
    lVar14 = uVar8 + lVar5 + *(long *)((long)plVar2 + (uVar4 - 0x1f));
    uVar21 = lVar19 + uVar6 + lVar14;
    lVar10 = uVar7 * lVar3 + *(long *)((long)plVar2 + (uVar4 - 0x3f));
    lVar19 = *(long *)((long)plVar2 + (uVar4 - 0x27)) + uVar12;
    uVar4 = lVar9 + uVar4 + lVar10 + lVar19;
    uVar6 = lVar16 + lVar11 + lVar10;
    uVar7 = uVar21 + lVar20 ^ uVar15;
    uVar8 = (uVar6 + lVar19 ^ uVar7) * lVar3;
    uVar7 = (uVar8 >> 0x2f ^ uVar7 ^ uVar8) * lVar3;
    uVar8 = lVar11 + uVar15 + lVar20 + lVar14;
    uVar8 = lVar14 + lVar5 + (uVar21 >> 0x2c | uVar21 * 0x100000) + (uVar8 >> 0x15 | uVar8 << 0x2b);
    uVar4 = ((uVar6 >> 0x2c | uVar6 * 0x100000) + lVar10 + uVar15 + (uVar4 >> 0x15 | uVar4 << 0x2b)
            ^ uVar8) * -0x651e95c4d06fbfb1;
    uVar4 = uVar4 >> 0x2f ^ uVar8 ^ uVar4;
    uVar12 = (uVar4 * -0x41befec400000000 | uVar4 * -0x651e95c4d06fbfb1 >> 0x1e) *
             -0x651e95c4d06fbfb1 ^ uVar12;
    uVar4 = (((uVar7 >> 0x2f ^ uVar7) + uVar13) * lVar3 - lVar17 ^ uVar12) * -0x651e95c4d06fbfb1;
    uVar4 = uVar4 >> 0x2f ^ uVar12 ^ uVar4;
    uVar1 = (uVar4 * 0x5f20809e00000000 | uVar4 * -0x651e95c4d06fbfb1 >> 0x1f) * -0x651e95c4d06fbfb1
    ;
  }
  return uVar1;
}

Assistant:

uint64_t Hash64WithSeeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhashna::Hash64WithSeeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = farmhashna::ShiftMix(y * k2) * k2;
  pair<uint64_t, uint64_t> v = make_pair(seed0, seed1);
  pair<uint64_t, uint64_t> w = make_pair(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = Fetch(s);
    uint64_t a1 = Fetch(s + 8);
    uint64_t a2 = Fetch(s + 16);
    uint64_t a3 = Fetch(s + 24);
    uint64_t a4 = Fetch(s + 32);
    uint64_t a5 = Fetch(s + 40);
    uint64_t a6 = Fetch(s + 48);
    uint64_t a7 = Fetch(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.first += a4;
    v.second += a5 + a1;
    w.first += a6;
    w.second += a7;

    x = Rotate(x, 26);
    x *= 9;
    y = Rotate(y, 29);
    z *= mul;
    v.first = Rotate(v.first, 33);
    v.second = Rotate(v.second, 30);
    w.first ^= x;
    w.first *= 9;
    z = Rotate(z, 32);
    z += w.second;
    w.second += z;
    z *= 9;
    std::swap(u, y);

    z += a0 + a6;
    v.first += a2;
    v.second += a3;
    w.first += a4;
    w.second += a5 + a6;
    x += a1;
    y += a7;

    y += v.first;
    v.first += x - y;
    v.second += w.first;
    w.first += v.second;
    w.second += x - y;
    x += w.second;
    w.second = Rotate(w.second, 34);
    std::swap(u, z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.second = Rotate(v.second, 28);
  v.first = Rotate(v.first, 20);
  w.first += ((len - 1) & 63);
  u += y;
  y += u;
  x = Rotate(y - x + v.first + Fetch(s + 8), 37) * mul;
  y = Rotate(y ^ v.second ^ Fetch(s + 48), 42) * mul;
  x ^= w.second * 9;
  y += v.first + Fetch(s + 40);
  z = Rotate(z + w.first, 33) * mul;
  v = farmhashna::WeakHashLen32WithSeeds(s, v.second * mul, x + w.first);
  w = farmhashna::WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
  return H(farmhashna::HashLen16(v.first + x, w.first ^ y, mul) + z - u,
           H(v.second + y, w.second + z, k2, 30) ^ x,
           k2,
           31);
}